

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyArchiveRelease(SyArchive *pArch)

{
  SyArchiveEntry *pSVar1;
  SyArchiveEntry *pNext;
  SyArchiveEntry *pEntry;
  SyArchive *pArch_local;
  
  pNext = pArch->pList;
  while (pArch->nLoaded != 0) {
    pSVar1 = pNext->pNext;
    if (pArch->pList == pNext) {
      pArch->pList = pArch->pList->pNext;
    }
    if (pNext->pPrev != (SyArchiveEntry *)0x0) {
      pNext->pPrev->pNext = pNext->pNext;
    }
    if (pNext->pNext != (SyArchiveEntry *)0x0) {
      pNext->pNext->pPrev = pNext->pPrev;
    }
    ArchiveReleaseEntry(pArch->pAllocator,pNext);
    pArch->nLoaded = pArch->nLoaded - 1;
    pNext = pSVar1;
  }
  SyMemBackendFree(pArch->pAllocator,pArch->apHash);
  pArch->pCursor = (SyArchiveEntry *)0x0;
  pArch->nMagic = 0x2626;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyArchiveRelease(SyArchive *pArch)
 {
	SyArchiveEntry *pEntry, *pNext;
 	pEntry = pArch->pList; 	 	
	for(;;){
		if( pArch->nLoaded < 1 ){
			break;
		}
		pNext = pEntry->pNext;
		MACRO_LD_REMOVE(pArch->pList, pEntry);
		ArchiveReleaseEntry(pArch->pAllocator, pEntry);
		pEntry = pNext;
		pArch->nLoaded--;
	}
	SyMemBackendFree(pArch->pAllocator, pArch->apHash);
	pArch->pCursor = 0;
	pArch->nMagic = 0x2626;
	return SXRET_OK;
 }